

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::WasmByteCodeWriter::TryWriteFloat1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,float C1)

{
  bool bVar1;
  Data *this_00;
  undefined1 local_16 [8];
  OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((DAT_015b5fbd != '\0') || (0xffff < R0)) || (NAN(C1))) {
    bVar1 = false;
  }
  else {
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,local_16,6);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteFloat1Const1(OpCodeAsmJs op, RegSlot R0, float C1)
    {
        OpLayoutT_Float1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.F0, R0) && SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }